

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask15_24(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 0xf | *out;
  *out = in[2] << 0x1e | *out;
  puVar1 = out + 1;
  *puVar1 = in[2] >> 2;
  *puVar1 = in[3] << 0xd | *puVar1;
  *puVar1 = in[4] << 0x1c | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[4] >> 4;
  *puVar1 = in[5] << 0xb | *puVar1;
  *puVar1 = in[6] << 0x1a | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[6] >> 6;
  *puVar1 = in[7] << 9 | *puVar1;
  *puVar1 = in[8] << 0x18 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[8] >> 8;
  *puVar1 = in[9] << 7 | *puVar1;
  *puVar1 = in[10] << 0x16 | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[10] >> 10;
  *puVar1 = in[0xb] << 5 | *puVar1;
  *puVar1 = in[0xc] << 0x14 | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[0xc] >> 0xc;
  *puVar1 = in[0xd] << 3 | *puVar1;
  *puVar1 = in[0xe] << 0x12 | *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[0xe] >> 0xe;
  *puVar1 = in[0xf] << 1 | *puVar1;
  *puVar1 = in[0x10] << 0x10 | *puVar1;
  *puVar1 = in[0x11] << 0x1f | *puVar1;
  puVar1 = out + 8;
  *puVar1 = in[0x11] >> 1;
  *puVar1 = in[0x12] << 0xe | *puVar1;
  *puVar1 = in[0x13] << 0x1d | *puVar1;
  puVar1 = out + 9;
  *puVar1 = in[0x13] >> 3;
  *puVar1 = in[0x14] << 0xc | *puVar1;
  *puVar1 = in[0x15] << 0x1b | *puVar1;
  puVar1 = out + 10;
  *puVar1 = in[0x15] >> 5;
  *puVar1 = in[0x16] << 10 | *puVar1;
  *puVar1 = in[0x17] << 0x19 | *puVar1;
  out[0xb] = in[0x17] >> 7;
  return out + 0xc;
}

Assistant:

uint32_t *__fastpackwithoutmask15_24(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (15 - 13);
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (15 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (15 - 9);
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (15 - 7);
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (15 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (15 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (15 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (15 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (15 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (15 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (15 - 8);
  ++in;

  return out + 1;
}